

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O0

CTcSymbol * __thiscall
CVmDynFuncSymtab::find_direct(CVmDynFuncSymtab *this,textchar_t *sym,size_t len)

{
  CTcPrsSymtab *in_RDI;
  textchar_t *unaff_retaddr;
  CVmDynFuncSymtab *in_stack_00000008;
  CTcSymbol *ret;
  size_t in_stack_000000e8;
  textchar_t *in_stack_000000f0;
  CVmDynFuncSymtab *in_stack_000000f8;
  CTcSymbol *in_stack_ffffffffffffffc8;
  undefined8 local_28;
  size_t in_stack_fffffffffffffff8;
  
  local_28 = CTcPrsSymtab::find_direct(in_RDI,(textchar_t *)in_stack_ffffffffffffffc8,0x330a2c);
  if (local_28 == (CTcSymbol *)0x0) {
    local_28 = find_local(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8);
    if (local_28 == (CTcSymbol *)0x0) {
      local_28 = find_global(in_stack_000000f8,in_stack_000000f0,in_stack_000000e8);
    }
    if (local_28 != (CTcSymbol *)0x0) {
      CTcPrsSymtab::add_entry(in_RDI,in_stack_ffffffffffffffc8);
    }
  }
  return local_28;
}

Assistant:

virtual CTcSymbol *find_direct(const textchar_t *sym, size_t len)
    {
        /* first, check the cache to see if we've already looked it up */
        CTcSymbol *ret = CTcPrsSymtab::find_direct(sym, len);
        if (ret != 0)
            return ret;

        /* 
         *   Didn't find it - check the user-code tables.
         */

        /* try our local symbol table */
        ret = find_local(sym, len);

        /* if that didn't work, try our global symbol table */
        if (ret == 0)
            ret = find_global(sym, len);

        /* if we found a symbol, add it to the cache */
        if (ret != 0)
            CTcPrsSymtab::add_entry(ret);

        /* return the symbol */
        return ret;
    }